

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::anon_unknown_3::pixelNearLineSegment(IVec2 *pixel,Vec2 *p0,Vec2 *p1)

{
  float fVar1;
  Type_conflict TVar2;
  Type_conflict TVar3;
  float fVar4;
  Vec2 line;
  Vec2 v;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  float local_30;
  float local_2c;
  
  local_38.m_data[0] = (float)(int)*(undefined8 *)pixel->m_data + 0.5;
  local_38.m_data[1] = (float)(int)((ulong)*(undefined8 *)pixel->m_data >> 0x20) + 0.5;
  tcu::operator-(p1,p0);
  tcu::operator-(&local_38,p0);
  fVar4 = local_40.m_data[0] * local_2c - local_30 * local_40.m_data[1];
  fVar1 = lengthSquared<float,2>(&local_40);
  if (fVar4 * fVar4 <= fVar1 + fVar1) {
    tcu::operator-(p1,p0);
    TVar2 = length<float,2>(&local_40);
    tcu::operator-(&local_38,p0);
    TVar3 = length<float,2>(&local_40);
    if (TVar3 <= TVar2 + 1.414) {
      tcu::operator-(&local_38,p1);
      TVar3 = length<float,2>(&local_40);
      return TVar3 <= TVar2 + 1.414;
    }
  }
  return false;
}

Assistant:

bool pixelNearLineSegment (const tcu::IVec2& pixel, const tcu::Vec2& p0, const tcu::Vec2& p1)
{
	const tcu::Vec2 pixelCenterPosition = tcu::Vec2((float)pixel.x() + 0.5f, (float)pixel.y() + 0.5f);

	// "Near" = Distance from the line to the pixel is less than 2 * pixel_max_radius. (pixel_max_radius = sqrt(2) / 2)
	const float maxPixelDistance		= 1.414f;
	const float maxPixelDistanceSquared	= 2.0f;

	// Near the line
	{
		const tcu::Vec2	line			= p1                  - p0;
		const tcu::Vec2	v				= pixelCenterPosition - p0;
		const float		crossProduct	= (line.x() * v.y() - line.y() * v.x());

		// distance to line: (line x v) / |line|
		//     |(line x v) / |line|| > maxPixelDistance
		// ==> (line x v)^2 / |line|^2 > maxPixelDistance^2
		// ==> (line x v)^2 > maxPixelDistance^2 * |line|^2

		if (crossProduct * crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(line))
			return false;
	}

	// Between the endpoints
	{
		// distance from line endpoint 1 to pixel is less than line length + maxPixelDistance
		const float maxDistance = tcu::length(p1 - p0) + maxPixelDistance;

		if (tcu::length(pixelCenterPosition - p0) > maxDistance)
			return false;
		if (tcu::length(pixelCenterPosition - p1) > maxDistance)
			return false;
	}

	return true;
}